

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar4;
  __m128 _outp;
  __m128 _p1;
  __m128 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_div op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  Allocator *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  Mat *in_stack_fffffffffffffbf0;
  undefined8 uStack_3a0;
  float local_398 [2];
  float afStack_390 [2];
  float local_388 [2];
  float afStack_380 [5];
  int local_36c;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_350;
  long local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  float *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined4 local_300;
  long local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined8 local_2d8;
  float *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  long local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined8 local_288;
  float *local_280;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  binary_op_div local_259 [9];
  long *local_250;
  long *local_248;
  long *local_240;
  int local_234;
  long *local_230;
  undefined1 local_225;
  int local_224;
  undefined8 *local_218;
  undefined1 local_20d;
  int local_20c;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined1 local_1bd;
  int local_1bc;
  undefined8 *local_1b0;
  undefined8 *local_1a0;
  float *local_198;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float *local_178;
  long *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  float *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  float *local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  undefined8 *local_68;
  undefined8 *local_58;
  
  local_260 = *(int *)((long)in_RDI + 0x2c);
  local_264 = (int)in_RDI[6];
  local_268 = *(int *)((long)in_RDI + 0x34);
  local_26c = (int)in_RDI[7];
  local_270 = (int)in_RDI[3];
  local_274 = local_260 * local_264 * local_268 * local_270;
  local_250 = in_RDX;
  local_248 = in_RSI;
  local_240 = in_RDI;
  Mat::create_like(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  local_230 = local_250;
  bVar2 = true;
  if (*local_250 != 0) {
    local_170 = local_250;
    bVar2 = local_250[8] * (long)(int)local_250[7] == 0;
  }
  if (bVar2) {
    local_234 = -100;
  }
  else {
    for (local_278 = 0; local_278 < local_26c; local_278 = local_278 + 1) {
      local_200 = &local_2c8;
      local_104 = *(int *)((long)local_240 + 0x2c);
      local_108 = (int)local_240[6];
      local_10c = *(undefined4 *)((long)local_240 + 0x34);
      local_280 = (float *)(*local_240 + local_240[8] * (long)local_278 * local_240[2]);
      local_120 = local_240[2];
      local_124 = (undefined4)local_240[3];
      local_130 = local_240[4];
      local_100 = &local_2c8;
      local_a8 = (long)local_104 * (long)local_108 * local_120;
      local_1f0 = &local_2c8;
      local_1d8 = &local_2c8;
      local_218 = &local_318;
      local_cc = *(int *)((long)local_248 + 0x2c);
      local_d0 = (int)local_248[6];
      local_d4 = *(undefined4 *)((long)local_248 + 0x34);
      local_2d0 = (float *)(*local_248 + local_248[8] * (long)local_278 * local_248[2]);
      local_e8 = local_248[2];
      local_ec = (undefined4)local_248[3];
      local_f8 = local_248[4];
      local_c8 = &local_318;
      local_b8 = (long)local_cc * (long)local_d0 * local_e8;
      local_1f8 = &local_318;
      local_1d0 = &local_318;
      local_1b0 = &local_368;
      local_13c = *(int *)((long)local_250 + 0x2c);
      local_140 = (int)local_250[6];
      local_144 = *(undefined4 *)((long)local_250 + 0x34);
      local_320 = (float *)(*local_250 + local_250[8] * (long)local_278 * local_250[2]);
      local_158 = local_250[2];
      local_15c = (undefined4)local_250[3];
      local_168 = local_250[4];
      local_138 = &local_368;
      local_98 = (long)local_13c * (long)local_140 * local_158;
      local_1a0 = &local_368;
      local_1c8 = &local_368;
      local_290 = 0;
      local_294 = 0;
      local_298 = 0;
      local_29c = 0;
      local_2b0 = 0;
      local_2b8 = 0;
      local_2c0 = 0;
      local_2c8 = 0;
      local_2e0 = 0;
      local_2e4 = 0;
      local_2e8 = 0;
      local_2ec = 0;
      local_300 = 0;
      local_308 = 0;
      local_310 = 0;
      local_318 = 0;
      local_9c = 0x10;
      local_ac = 0x10;
      local_bc = 0x10;
      local_1bc = local_278;
      local_1bd = 1;
      local_20c = local_278;
      local_20d = 1;
      local_224 = local_278;
      local_225 = 1;
      local_288 = 0;
      local_2a0 = 0;
      local_2d8 = 0;
      local_2f0 = 0;
      local_368 = 0;
      local_358 = 0;
      local_350 = 0;
      local_340 = 0;
      local_33c = 0;
      local_338 = 0;
      local_334 = 0;
      local_330 = 0;
      local_328 = 0;
      local_360 = 0;
      local_150 = local_320;
      local_118 = local_280;
      local_e0 = local_2d0;
      local_78 = local_1c8;
      local_68 = local_1d0;
      local_58 = local_1d8;
      local_348 = local_168;
      local_2f8 = local_f8;
      local_2a8 = local_130;
      for (local_36c = 0; local_36c + 3 < local_274; local_36c = local_36c + 4) {
        local_190 = local_280;
        local_388 = *(float (*) [2])local_280;
        afStack_380._0_8_ = *(undefined8 *)(local_280 + 2);
        local_198 = local_2d0;
        local_398 = *(float (*) [2])local_2d0;
        afStack_390 = *(float (*) [2])(local_2d0 + 2);
        afVar4 = BinaryOp_x86_functor::binary_op_div::func_pack4
                           (local_259,(__m128 *)local_388,(__m128 *)local_398);
        local_188 = afVar4._0_8_;
        auVar1._8_4_ = extraout_XMM0_Dc;
        auVar1._0_8_ = local_188;
        auVar1._12_4_ = extraout_XMM0_Dd;
        local_178 = local_320;
        uStack_3a0 = auVar1._8_8_;
        uStack_180 = uStack_3a0;
        *(undefined8 *)local_320 = local_188;
        *(undefined8 *)(local_320 + 2) = uStack_3a0;
        local_280 = local_280 + 4;
        local_2d0 = local_2d0 + 4;
        local_320 = local_320 + 4;
      }
      for (; local_36c < local_274; local_36c = local_36c + 1) {
        fVar3 = BinaryOp_x86_functor::binary_op_div::func(local_259,local_280,local_2d0);
        *local_320 = fVar3;
        local_280 = local_280 + 1;
        local_2d0 = local_2d0 + 1;
        local_320 = local_320 + 1;
      }
    }
    local_234 = 0;
  }
  return local_234;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}